

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_compute_sighash(secp256k1_scalar *r,uchar *prehash,size_t index)

{
  ulong in_RDX;
  uchar ch;
  secp256k1_sha256 hasher;
  int overflow;
  uchar output [32];
  undefined7 in_stack_ffffffffffffff50;
  byte in_stack_ffffffffffffff57;
  uchar *in_stack_ffffffffffffff58;
  secp256k1_sha256 *in_stack_ffffffffffffff60;
  uchar *in_stack_ffffffffffffff78;
  secp256k1_sha256 *in_stack_ffffffffffffff80;
  int local_3c;
  ulong local_18;
  
  secp256k1_sha256_initialize((secp256k1_sha256 *)&stack0xffffffffffffff58);
  for (local_18 = in_RDX; local_18 != 0; local_18 = local_18 >> 7) {
    in_stack_ffffffffffffff57 = (byte)local_18 & 0x7f;
    secp256k1_sha256_write
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               CONCAT17((byte)local_18,in_stack_ffffffffffffff50) & 0x7fffffffffffffff);
  }
  secp256k1_sha256_write
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  secp256k1_sha256_finalize(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  secp256k1_scalar_set_b32
            ((secp256k1_scalar *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             (int *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  return (int)((local_3c != 0 ^ 0xffU) & 1);
}

Assistant:

static int secp256k1_compute_sighash(secp256k1_scalar *r, const unsigned char *prehash, size_t index) {
    unsigned char output[32];
    int overflow;
    secp256k1_sha256 hasher;
    secp256k1_sha256_initialize(&hasher);
    /* Encode index as a UTF8-style bignum */
    while (index > 0) {
        unsigned char ch = index & 0x7f;
        secp256k1_sha256_write(&hasher, &ch, 1);
        index >>= 7;
    }
    secp256k1_sha256_write(&hasher, prehash, 32);
    secp256k1_sha256_finalize(&hasher, output);
    secp256k1_scalar_set_b32(r, output, &overflow);
    return !overflow;
}